

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHDivProjection.cpp
# Opt level: O0

void __thiscall
TPZHDivProjection<double>::Contribute
          (TPZHDivProjection<double> *this,TPZMaterialDataT<double> *data,REAL weight,
          TPZFMatrix<double> *ek,TPZFMatrix<double> *ef)

{
  double dVar1;
  double dVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int64_t iVar7;
  long *plVar8;
  long *plVar9;
  pair<int,_long> *ppVar10;
  double *pdVar11;
  long in_RSI;
  long *in_RDI;
  TPZFMatrix<double> *in_XMM0_Qa;
  double dVar12;
  double dVar13;
  int jloc;
  TPZFNMatrix<3,_double> axesvec_1;
  REAL divqj;
  REAL prod1;
  int id_1;
  int jshapeind;
  int jvecind;
  int jq;
  int iloc;
  TPZFNMatrix<3,_double> axesvec;
  REAL divqi;
  int i;
  double ff;
  int id;
  int ishapeind;
  int ivecind;
  int iq;
  TPZFNMatrix<3,_double> jvec;
  TPZFNMatrix<3,_double> ivec;
  int phrq;
  TPZFMatrix<double> *dphiQ;
  TPZFMatrix<double> *phiQ;
  double divSol;
  TPZManVector<double,_4> solLoc;
  int nshape;
  TPZManVector<double,_4> *in_stack_fffffffffffffad0;
  TPZVec<double> *in_stack_fffffffffffffad8;
  function<void_(const_TPZVec<double>_&,_TPZVec<double>_&)> *in_stack_fffffffffffffae0;
  double in_stack_fffffffffffffae8;
  TPZFMatrix<double> *in_stack_fffffffffffffaf0;
  double *in_stack_fffffffffffffaf8;
  double in_stack_fffffffffffffb00;
  double *in_stack_fffffffffffffb08;
  TPZFNMatrix<3,_double> *in_stack_fffffffffffffb10;
  double in_stack_fffffffffffffb18;
  TPZFMatrix<double> *in_stack_fffffffffffffb20;
  TPZFMatrix<double> *in_stack_fffffffffffffb28;
  TPZMatrix<double> *in_stack_fffffffffffffb30;
  int local_3d4;
  TPZManVector<double,_4> *local_318;
  int local_304;
  int local_2f8;
  int local_2f4;
  double local_238;
  int local_22c;
  double local_228;
  int local_220;
  int local_214;
  size_t in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  TPZVec<double> local_70 [2];
  undefined4 local_2c;
  TPZFMatrix<double> *local_18;
  long local_10;
  
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  iVar7 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RSI + 0x3900));
  local_2c = (undefined4)iVar7;
  TPZManVector<double,_4>::TPZManVector
            ((TPZManVector<double,_4> *)in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8
            );
  bVar4 = (**(code **)(*in_RDI + 0x60))();
  local_318 = in_stack_fffffffffffffad0;
  if ((bVar4 & 1) == 0) {
    std::operator<<((ostream *)&std::cerr,
                    "virtual void TPZHDivProjection<>::Contribute(const TPZMaterialDataT<TVar> &, REAL, TPZFMatrix<TVar> &, TPZFMatrix<TVar> &) [TVar = double]"
                   );
    std::operator<<((ostream *)&std::cerr," a forcing function (solution to be projected)\n");
    std::operator<<((ostream *)&std::cerr,"has not been set! Aborting...\n");
    pzinternal::DebugStopImpl(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    local_318 = in_stack_fffffffffffffad0;
  }
  std::function<void_(const_TPZVec<double>_&,_TPZVec<double>_&)>::operator()
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,&local_318->super_TPZVec<double>);
  TPZVec<double>::operator[](local_70,3);
  plVar8 = (long *)(local_10 + 0x3900);
  plVar9 = (long *)(local_10 + 0x3a38);
  iVar7 = TPZVec<std::pair<int,_long>_>::NElements
                    ((TPZVec<std::pair<int,_long>_> *)(local_10 + 0x42c0));
  TPZFNMatrix<3,_double>::TPZFNMatrix
            (in_stack_fffffffffffffb10,(int64_t)in_stack_fffffffffffffb08,
             (int64_t)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  TPZFNMatrix<3,_double>::TPZFNMatrix
            (in_stack_fffffffffffffb10,(int64_t)in_stack_fffffffffffffb08,
             (int64_t)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  for (local_214 = 0; local_214 < (int)iVar7; local_214 = local_214 + 1) {
    ppVar10 = TPZVec<std::pair<int,_long>_>::operator[]
                        ((TPZVec<std::pair<int,_long>_> *)(local_10 + 0x42c0),(long)local_214);
    iVar3 = ppVar10->first;
    ppVar10 = TPZVec<std::pair<int,_long>_>::operator[]
                        ((TPZVec<std::pair<int,_long>_> *)(local_10 + 0x42c0),(long)local_214);
    iVar5 = (int)ppVar10->second;
    for (local_220 = 0; local_220 < 3; local_220 = local_220 + 1) {
      dVar12 = TPZFMatrix<double>::GetVal
                         ((TPZFMatrix<double> *)(local_10 + 0x4420),(long)local_220,(long)iVar3);
      pdVar11 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8,
                           (int64_t)in_stack_fffffffffffffae0);
      *pdVar11 = dVar12;
    }
    local_228 = 0.0;
    for (local_22c = 0; local_22c < 3; local_22c = local_22c + 1) {
      pdVar11 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8,
                           (int64_t)in_stack_fffffffffffffae0);
      dVar12 = *pdVar11;
      pdVar11 = TPZVec<double>::operator[](local_70,(long)local_22c);
      local_228 = dVar12 * *pdVar11 + local_228;
    }
    local_228 = (double)local_18 * local_228;
    dVar12 = (double)(**(code **)(*plVar8 + 0x120))(plVar8,(long)iVar5,0);
    pdVar11 = TPZFMatrix<double>::operator()
                        (in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8,
                         (int64_t)in_stack_fffffffffffffae0);
    *pdVar11 = local_228 * dVar12 + *pdVar11;
    local_238 = 0.0;
    TPZFNMatrix<3,_double>::TPZFNMatrix
              (in_stack_fffffffffffffb10,(int64_t)in_stack_fffffffffffffb08,
               (int64_t)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    TPZMatrix<double>::Multiply
              (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
               (int)((ulong)in_stack_fffffffffffffb18 >> 0x20));
    for (local_2f4 = 0; local_2f4 < (int)in_RDI[10]; local_2f4 = local_2f4 + 1) {
      pdVar11 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8,
                           (int64_t)in_stack_fffffffffffffae0);
      dVar12 = *pdVar11;
      dVar13 = (double)(**(code **)(*plVar9 + 0x120))(plVar9,(long)local_2f4,(long)iVar5);
      local_238 = dVar12 * dVar13 + local_238;
    }
    for (local_2f8 = 0; local_2f8 < (int)iVar7; local_2f8 = local_2f8 + 1) {
      ppVar10 = TPZVec<std::pair<int,_long>_>::operator[]
                          ((TPZVec<std::pair<int,_long>_> *)(local_10 + 0x42c0),(long)local_2f8);
      iVar3 = ppVar10->first;
      ppVar10 = TPZVec<std::pair<int,_long>_>::operator[]
                          ((TPZVec<std::pair<int,_long>_> *)(local_10 + 0x42c0),(long)local_2f8);
      iVar6 = (int)ppVar10->second;
      for (local_304 = 0; local_304 < 3; local_304 = local_304 + 1) {
        dVar12 = TPZFMatrix<double>::GetVal
                           ((TPZFMatrix<double> *)(local_10 + 0x4420),(long)local_304,(long)iVar3);
        pdVar11 = TPZFMatrix<double>::operator()
                            (in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8,
                             (int64_t)in_stack_fffffffffffffae0);
        *pdVar11 = dVar12;
      }
      pdVar11 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8,
                           (int64_t)in_stack_fffffffffffffae0);
      dVar12 = *pdVar11;
      pdVar11 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8,
                           (int64_t)in_stack_fffffffffffffae0);
      dVar13 = *pdVar11;
      pdVar11 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8,
                           (int64_t)in_stack_fffffffffffffae0);
      dVar1 = *pdVar11;
      pdVar11 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8,
                           (int64_t)in_stack_fffffffffffffae0);
      dVar2 = *pdVar11;
      pdVar11 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8,
                           (int64_t)in_stack_fffffffffffffae0);
      in_stack_fffffffffffffb30 = (TPZMatrix<double> *)*pdVar11;
      pdVar11 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8,
                           (int64_t)in_stack_fffffffffffffae0);
      in_stack_fffffffffffffb00 =
           (double)in_stack_fffffffffffffb30 * *pdVar11 + dVar12 * dVar13 + dVar1 * dVar2;
      in_stack_fffffffffffffb20 = local_18;
      in_stack_fffffffffffffb28 =
           (TPZFMatrix<double> *)(**(code **)(*plVar8 + 0x120))(plVar8,(long)iVar5,0);
      in_stack_fffffffffffffb10 =
           (TPZFNMatrix<3,_double> *)
           ((double)in_stack_fffffffffffffb20 * (double)in_stack_fffffffffffffb28);
      in_stack_fffffffffffffb18 = (double)(**(code **)(*plVar8 + 0x120))(plVar8,(long)iVar6,0);
      in_stack_fffffffffffffaf8 =
           (double *)((double)in_stack_fffffffffffffb10 * in_stack_fffffffffffffb18);
      in_stack_fffffffffffffb08 =
           TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8,
                      (int64_t)in_stack_fffffffffffffae0);
      *in_stack_fffffffffffffb08 =
           (double)in_stack_fffffffffffffaf8 * in_stack_fffffffffffffb00 +
           *in_stack_fffffffffffffb08;
      local_318 = (TPZManVector<double,_4> *)0x0;
      TPZFNMatrix<3,_double>::TPZFNMatrix
                (in_stack_fffffffffffffb10,(int64_t)in_stack_fffffffffffffb08,
                 (int64_t)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
      TPZMatrix<double>::Multiply
                (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                 (int)((ulong)in_stack_fffffffffffffb18 >> 0x20));
      for (local_3d4 = 0; local_3d4 < (int)in_RDI[10]; local_3d4 = local_3d4 + 1) {
        in_stack_fffffffffffffaf0 =
             (TPZFMatrix<double> *)
             TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8,
                        (int64_t)in_stack_fffffffffffffae0);
        in_stack_fffffffffffffae0 =
             (function<void_(const_TPZVec<double>_&,_TPZVec<double>_&)> *)
             (in_stack_fffffffffffffaf0->super_TPZMatrix<double>).super_TPZBaseMatrix.
             super_TPZSavable._vptr_TPZSavable;
        in_stack_fffffffffffffae8 =
             (double)(**(code **)(*plVar9 + 0x120))(plVar9,(long)local_3d4,(long)iVar6);
        local_318 = (TPZManVector<double,_4> *)
                    ((double)in_stack_fffffffffffffae0 * in_stack_fffffffffffffae8 +
                    (double)local_318);
      }
      dVar12 = (double)local_18 * local_238;
      pdVar11 = TPZFMatrix<double>::operator()
                          (in_stack_fffffffffffffaf0,(int64_t)in_stack_fffffffffffffae8,
                           (int64_t)in_stack_fffffffffffffae0);
      *pdVar11 = dVar12 * (double)local_318 + *pdVar11;
      TPZFNMatrix<3,_double>::~TPZFNMatrix((TPZFNMatrix<3,_double> *)0x19902e9);
    }
    TPZFNMatrix<3,_double>::~TPZFNMatrix((TPZFNMatrix<3,_double> *)0x199030c);
  }
  TPZFNMatrix<3,_double>::~TPZFNMatrix((TPZFNMatrix<3,_double> *)0x199033e);
  TPZFNMatrix<3,_double>::~TPZFNMatrix((TPZFNMatrix<3,_double> *)0x199034b);
  TPZManVector<double,_4>::~TPZManVector(local_318);
  return;
}

Assistant:

void TPZHDivProjection<TVar>::Contribute(const TPZMaterialDataT<TVar> &data,
                                       REAL weight,
                                       TPZFMatrix<TVar> &ek, TPZFMatrix<TVar> &ef){
	
	const int nshape = data.phi.Rows();
    //last position of solLoc is the divergence
    TPZManVector<TVar,4> solLoc(4);
    if(!this->HasForcingFunction()){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" a forcing function (solution to be projected)\n";
        PZError<<"has not been set! Aborting...\n";
        DebugStop();
    }
    this->fForcingFunction(data.x,solLoc);
    const TVar divSol = solLoc[3];

    /*
     * HDiv approximation spaces in NeoPZ are created 
     * from the combination of scalar functions with 
     * constant vector fields
     */
    
    // Setting the scalar phis
    const TPZFMatrix<REAL> &phiQ = data.phi;
    const TPZFMatrix<REAL> &dphiQ = data.dphix;
    
    const int phrq = data.fVecShapeIndex.NElements();
    
    //Calculate the matrix contribution for flux. Matrix A
    TPZFNMatrix<3,REAL> ivec(3,1,0.);
    TPZFNMatrix<3,REAL> jvec(3,1,0.);
    for(int iq=0; iq<phrq; iq++)
    {
        //ef(iq, 0) += 0.;
        const int ivecind = data.fVecShapeIndex[iq].first;
        const int ishapeind = data.fVecShapeIndex[iq].second;
        
        for(int id=0; id<3; id++){
            ivec(id,0) = data.fDeformedDirections.GetVal(id,ivecind);
        }
        TVar ff = 0.;
        
        for (int i=0; i<3; i++) {
            ff += ivec(i,0)*solLoc[i];
        }
        
        ef(iq,0) += weight*ff*phiQ.GetVal(ishapeind,0);
        REAL divqi = 0.;
        TPZFNMatrix<3,REAL> axesvec(3,1,0.);
        data.axes.Multiply(ivec,axesvec);
        //computin div(qj)
        for(int iloc=0; iloc<fDim; iloc++){
            divqi += axesvec(iloc,0)*dphiQ.GetVal(iloc,ishapeind);
        }
        for (int jq=0; jq<phrq; jq++)
        {
            int jvecind = data.fVecShapeIndex[jq].first;
            int jshapeind = data.fVecShapeIndex[jq].second;
            
            for(int id=0; id<3; id++){
                jvec(id,0) = data.fDeformedDirections.GetVal(id,jvecind);
            }
            
            //jvecZ.Print("mat1 = ");
            const REAL prod1 = ivec(0,0)*jvec(0,0) + ivec(1,0)*jvec(1,0) + ivec(2,0)*jvec(2,0);
            ek(iq,jq) +=
                    weight*phiQ.GetVal(ishapeind,0)*phiQ.GetVal(jshapeind,0)*prod1;

            REAL divqj = 0.;
            TPZFNMatrix<3,REAL> axesvec(3,1,0.);
            data.axes.Multiply(jvec,axesvec);
            //computin div(qj)
            for(int jloc=0; jloc<fDim; jloc++){
                divqj += axesvec(jloc,0)*dphiQ.GetVal(jloc,jshapeind);
            }
            ek(iq,jq) += weight*divqi*divqj;
        }
    }
}